

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O0

void jpeg_fdct_7x7(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte *pbVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint in_EDX;
  long in_RSI;
  int *in_RDI;
  int ctr;
  JSAMPROW elemptr;
  DCTELEM *dataptr;
  INT32 z3;
  INT32 z2;
  INT32 z1;
  INT32 tmp12;
  INT32 tmp11;
  INT32 tmp10;
  INT32 tmp3;
  INT32 tmp2;
  INT32 tmp1;
  INT32 tmp0;
  int local_7c;
  int *local_70;
  
  memset(in_RDI,0,0x100);
  local_70 = in_RDI;
  for (local_7c = 0; local_7c < 7; local_7c = local_7c + 1) {
    pbVar1 = (byte *)(*(long *)(in_RSI + (long)local_7c * 8) + (ulong)in_EDX);
    lVar2 = (long)(int)((uint)*pbVar1 + (uint)pbVar1[6]);
    lVar3 = (long)(int)((uint)pbVar1[1] + (uint)pbVar1[5]);
    lVar4 = (long)(int)((uint)pbVar1[2] + (uint)pbVar1[4]);
    lVar5 = (long)(int)(uint)pbVar1[3];
    lVar6 = (long)(int)((uint)*pbVar1 - (uint)pbVar1[6]);
    lVar7 = (long)(int)((uint)pbVar1[1] - (uint)pbVar1[5]);
    lVar8 = (long)(int)((uint)pbVar1[2] - (uint)pbVar1[4]);
    *local_70 = ((int)(lVar2 + lVar4) + (uint)pbVar1[1] + (uint)pbVar1[5] + (uint)pbVar1[3] + -0x380
                ) * 4;
    lVar9 = (lVar2 + lVar4 + lVar5 * -2 + lVar5 * -2) * 0xb50;
    lVar10 = (lVar3 - lVar4) * 0xa12;
    local_70[2] = (int)(lVar9 + (lVar2 - lVar4) * 0x1d76 + lVar10 + 0x400 >> 0xb);
    lVar11 = (lVar2 - lVar3) * 0x1c37;
    local_70[4] = (int)(lVar11 + lVar10 + (lVar3 + lVar5 * -2) * -0x16a1 + 0x400 >> 0xb);
    local_70[6] = (int)(lVar9 + (lVar2 - lVar4) * -0x1d76 + lVar11 + 0x400 >> 0xb);
    lVar2 = (lVar6 + lVar7) * 0x1def;
    lVar3 = (lVar7 + lVar8) * -0x2c1f;
    lVar4 = (lVar6 + lVar8) * 0x13a3;
    local_70[1] = (int)(lVar4 + lVar2 + (lVar6 - lVar7) * -0x573 + 0x400 >> 0xb);
    local_70[3] = (int)(lVar3 + (lVar6 - lVar7) * 0x573 + lVar2 + 0x400 >> 0xb);
    local_70[5] = (int)(lVar4 + lVar8 * 0x3bde + lVar3 + 0x400 >> 0xb);
    local_70 = local_70 + 8;
  }
  local_70 = in_RDI;
  for (local_7c = 0; local_7c < 7; local_7c = local_7c + 1) {
    lVar2 = (long)(*local_70 + local_70[0x30]);
    lVar3 = (long)(local_70[8] + local_70[0x28]);
    lVar4 = (long)(local_70[0x10] + local_70[0x20]);
    lVar5 = (long)local_70[0x18];
    lVar6 = (long)(*local_70 - local_70[0x30]);
    lVar7 = (long)(local_70[8] - local_70[0x28]);
    lVar8 = (long)(local_70[0x10] - local_70[0x20]);
    *local_70 = (int)((lVar2 + lVar4 + lVar3 + lVar5) * 0x29cc + 0x4000 >> 0xf);
    lVar9 = (lVar2 + lVar4 + lVar5 * -2 + lVar5 * -2) * 0xec7;
    lVar10 = (lVar3 - lVar4) * 0xd27;
    local_70[0x10] = (int)(lVar9 + (lVar2 - lVar4) * 0x267a + lVar10 + 0x4000 >> 0xf);
    lVar11 = (lVar2 - lVar3) * 0x24da;
    local_70[0x20] = (int)(lVar11 + lVar10 + (lVar3 + lVar5 * -2) * -0x1d8e + 0x4000 >> 0xf);
    local_70[0x30] = (int)(lVar9 + (lVar2 - lVar4) * -0x267a + lVar11 + 0x4000 >> 0xf);
    lVar2 = (lVar6 + lVar7) * 0x2719;
    lVar3 = (lVar7 + lVar8) * -0x39a0;
    lVar4 = (lVar6 + lVar8) * 0x19a5;
    local_70[8] = (int)(lVar4 + lVar2 + (lVar6 - lVar7) * -0x71e + 0x4000 >> 0xf);
    local_70[0x18] = (int)(lVar3 + (lVar6 - lVar7) * 0x71e + lVar2 + 0x4000 >> 0xf);
    local_70[0x28] = (int)(lVar4 + lVar8 * 0x4e31 + lVar3 + 0x4000 >> 0xf);
    local_70 = local_70 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_7x7 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3;
  INT32 tmp10, tmp11, tmp12;
  INT32 z1, z2, z3;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* cK represents sqrt(2) * cos(K*pi/14). */

  dataptr = data;
  for (ctr = 0; ctr < 7; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[6]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[5]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[4]);
    tmp3 = GETJSAMPLE(elemptr[3]);

    tmp10 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[6]);
    tmp11 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[5]);
    tmp12 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[4]);

    z1 = tmp0 + tmp2;
    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((z1 + tmp1 + tmp3 - 7 * CENTERJSAMPLE) << PASS1_BITS);
    tmp3 += tmp3;
    z1 -= tmp3;
    z1 -= tmp3;
    z1 = MULTIPLY(z1, FIX(0.353553391));                /* (c2+c6-c4)/2 */
    z2 = MULTIPLY(tmp0 - tmp2, FIX(0.920609002));       /* (c2+c4-c6)/2 */
    z3 = MULTIPLY(tmp1 - tmp2, FIX(0.314692123));       /* c6 */
    dataptr[2] = (DCTELEM) DESCALE(z1 + z2 + z3, CONST_BITS-PASS1_BITS);
    z1 -= z2;
    z2 = MULTIPLY(tmp0 - tmp1, FIX(0.881747734));       /* c4 */
    dataptr[4] = (DCTELEM)
      DESCALE(z2 + z3 - MULTIPLY(tmp1 - tmp3, FIX(0.707106781)), /* c2+c6-c4 */
	      CONST_BITS-PASS1_BITS);
    dataptr[6] = (DCTELEM) DESCALE(z1 + z2, CONST_BITS-PASS1_BITS);

    /* Odd part */

    tmp1 = MULTIPLY(tmp10 + tmp11, FIX(0.935414347));   /* (c3+c1-c5)/2 */
    tmp2 = MULTIPLY(tmp10 - tmp11, FIX(0.170262339));   /* (c3+c5-c1)/2 */
    tmp0 = tmp1 - tmp2;
    tmp1 += tmp2;
    tmp2 = MULTIPLY(tmp11 + tmp12, - FIX(1.378756276)); /* -c1 */
    tmp1 += tmp2;
    tmp3 = MULTIPLY(tmp10 + tmp12, FIX(0.613604268));   /* c5 */
    tmp0 += tmp3;
    tmp2 += tmp3 + MULTIPLY(tmp12, FIX(1.870828693));   /* c3+c1-c5 */

    dataptr[1] = (DCTELEM) DESCALE(tmp0, CONST_BITS-PASS1_BITS);
    dataptr[3] = (DCTELEM) DESCALE(tmp1, CONST_BITS-PASS1_BITS);
    dataptr[5] = (DCTELEM) DESCALE(tmp2, CONST_BITS-PASS1_BITS);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by (8/7)**2 = 64/49, which we fold
   * into the constant multipliers:
   * cK now represents sqrt(2) * cos(K*pi/14) * 64/49.
   */

  dataptr = data;
  for (ctr = 0; ctr < 7; ctr++) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*6];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*5];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*4];
    tmp3 = dataptr[DCTSIZE*3];

    tmp10 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*6];
    tmp11 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*5];
    tmp12 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*4];

    z1 = tmp0 + tmp2;
    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(z1 + tmp1 + tmp3, FIX(1.306122449)), /* 64/49 */
	      CONST_BITS+PASS1_BITS);
    tmp3 += tmp3;
    z1 -= tmp3;
    z1 -= tmp3;
    z1 = MULTIPLY(z1, FIX(0.461784020));                /* (c2+c6-c4)/2 */
    z2 = MULTIPLY(tmp0 - tmp2, FIX(1.202428084));       /* (c2+c4-c6)/2 */
    z3 = MULTIPLY(tmp1 - tmp2, FIX(0.411026446));       /* c6 */
    dataptr[DCTSIZE*2] = (DCTELEM) DESCALE(z1 + z2 + z3, CONST_BITS+PASS1_BITS);
    z1 -= z2;
    z2 = MULTIPLY(tmp0 - tmp1, FIX(1.151670509));       /* c4 */
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(z2 + z3 - MULTIPLY(tmp1 - tmp3, FIX(0.923568041)), /* c2+c6-c4 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*6] = (DCTELEM) DESCALE(z1 + z2, CONST_BITS+PASS1_BITS);

    /* Odd part */

    tmp1 = MULTIPLY(tmp10 + tmp11, FIX(1.221765677));   /* (c3+c1-c5)/2 */
    tmp2 = MULTIPLY(tmp10 - tmp11, FIX(0.222383464));   /* (c3+c5-c1)/2 */
    tmp0 = tmp1 - tmp2;
    tmp1 += tmp2;
    tmp2 = MULTIPLY(tmp11 + tmp12, - FIX(1.800824523)); /* -c1 */
    tmp1 += tmp2;
    tmp3 = MULTIPLY(tmp10 + tmp12, FIX(0.801442310));   /* c5 */
    tmp0 += tmp3;
    tmp2 += tmp3 + MULTIPLY(tmp12, FIX(2.443531355));   /* c3+c1-c5 */

    dataptr[DCTSIZE*1] = (DCTELEM) DESCALE(tmp0, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp1, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*5] = (DCTELEM) DESCALE(tmp2, CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}